

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avsd_api.c
# Opt level: O0

MPP_RET avsd_init(void *decoder,ParserCfg *init)

{
  void *pvVar1;
  AvsdFrame_t *frm;
  AvsdCtx_t *p_dec;
  RK_S32 i;
  MPP_RET ret;
  ParserCfg *init_local;
  void *decoder_local;
  
  if ((avsd_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avsd_api","In.","avsd_init");
  }
  if (decoder == (void *)0x0) {
    if ((avsd_parse_debug & 4) != 0) {
      _mpp_log_l(4,"avsd_api","input empty(%d).\n",(char *)0x0,0x4a);
    }
LAB_001a5cff:
    if ((avsd_parse_debug & 8) != 0) {
      _mpp_log_l(4,"avsd_api","Out.","avsd_init");
    }
    decoder_local._4_4_ = MPP_OK;
  }
  else {
    memset(decoder,0,400);
    mpp_env_get_u32("avsd_debug",&avsd_parse_debug,0);
    memcpy((void *)((long)decoder + 0x20),init,0x28);
    *(MppBufSlots *)decoder = init->frame_slots;
    *(MppBufSlots *)((long)decoder + 8) = init->packet_slots;
    mpp_buf_slot_setup(*decoder,0xc);
    pvVar1 = mpp_osal_calloc("avsd_init",0x228);
    *(void **)((long)decoder + 0x50) = pvVar1;
    if (*(long *)((long)decoder + 0x50) == 0) {
      _mpp_log_l(2,"avsd_api","malloc buffer error(%d).\n","avsd_init",0x55);
    }
    else {
      *(undefined8 *)((long)decoder + 0x140) = *(undefined8 *)((long)decoder + 0x50);
      *(undefined4 *)((long)decoder + 100) = 0x200000;
      pvVar1 = mpp_osal_malloc("avsd_init",(ulong)*(uint *)((long)decoder + 100));
      *(void **)((long)decoder + 0x58) = pvVar1;
      if (*(long *)((long)decoder + 0x58) == 0) {
        _mpp_log_l(2,"avsd_api","malloc buffer error(%d).\n","avsd_init",0x5a);
      }
      else {
        mpp_packet_init((MppPacket *)((long)decoder + 0x10),*(void **)((long)decoder + 0x58),
                        (ulong)*(uint *)((long)decoder + 100));
        mpp_packet_set_length(*(MppPacket *)((long)decoder + 0x10),0);
        if (*(long *)((long)decoder + 0x10) != 0) {
          for (p_dec._0_4_ = 0; (int)p_dec < 3; p_dec._0_4_ = (int)p_dec + 1) {
            pvVar1 = (void *)(*(long *)((long)decoder + 0x50) + 0x110 + (long)(int)p_dec * 0x40);
            memset(pvVar1,0,0x40);
            *(int *)((long)pvVar1 + 4) = (int)p_dec;
            *(undefined4 *)((long)pvVar1 + 0x3c) = 0xffffffff;
          }
          *(long *)((long)decoder + 0x68) = *(long *)((long)decoder + 0x50) + 0x1d0;
          *(undefined4 *)((long)decoder + 0x160) = 1;
          goto LAB_001a5cff;
        }
        _mpp_log_l(2,"avsd_api","malloc buffer error(%d).\n","avsd_init",0x5e);
      }
    }
    avsd_deinit(decoder);
    decoder_local._4_4_ = MPP_ERR_MALLOC;
  }
  return decoder_local._4_4_;
}

Assistant:

static MPP_RET avsd_init(void *decoder, ParserCfg *init)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    RK_S32 i = 0;
    AvsdCtx_t *p_dec = (AvsdCtx_t *)decoder;

    AVSD_PARSE_TRACE("In.");
    INP_CHECK(ret, !p_dec);

    memset(p_dec, 0, sizeof(AvsdCtx_t));
    mpp_env_get_u32("avsd_debug", &avsd_parse_debug, 0);
    //!< restore init parameters
    p_dec->init = *init;
    p_dec->frame_slots = init->frame_slots;
    p_dec->packet_slots = init->packet_slots;
    //!< decoder parameters
    mpp_buf_slot_setup(p_dec->frame_slots, 12);
    p_dec->mem = mpp_calloc(AvsdMemory_t, 1);
    MEM_CHECK(ret, p_dec->mem);

    p_dec->syn = &p_dec->mem->syntax;
    p_dec->stream_size = MAX_STREAM_SIZE;
    p_dec->streambuf = mpp_malloc(RK_U8, p_dec->stream_size);
    MEM_CHECK(ret, p_dec->streambuf);
    mpp_packet_init(&p_dec->task_pkt, p_dec->streambuf, p_dec->stream_size);

    mpp_packet_set_length(p_dec->task_pkt, 0);
    MEM_CHECK(ret, p_dec->task_pkt);
    for (i = 0; i < 3; i++) {
        AvsdFrame_t *frm = &p_dec->mem->save[i];

        memset(frm, 0, sizeof(*frm));
        frm->idx = i;
        frm->slot_idx = -1;
    }
    p_dec->bx = &p_dec->mem->bitctx;
    p_dec->need_split = 1;

__RETURN:
    AVSD_PARSE_TRACE("Out.");
    return ret = MPP_OK;
__FAILED:
    avsd_deinit(decoder);

    return ret;
}